

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O3

int Cof_NodeRef_rec(Cof_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  
  uVar1 = *(uint *)pNode;
  if ((uVar1 & 0xf0) == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      *(uint *)pNode = uVar1 + 0x100;
      if (0xff < uVar1) {
        return iVar4;
      }
      iVar2 = Cof_NodeRef_rec((Cof_Obj_t *)
                              ((long)pNode + ((ulong)*(uint *)(pNode + 1) & 0x7fffffff) * -4));
      uVar3 = (ulong)pNode[1].nFanoutsM & 0x7fffffff;
      iVar4 = iVar4 + iVar2 + 1;
      uVar1 = *(uint *)((long)pNode + uVar3 * -4);
      pNode = (Cof_Obj_t *)((long)pNode + uVar3 * -4);
    } while ((uVar1 & 0xf0) != 0);
  }
  return iVar4;
}

Assistant:

int Cof_NodeRef_rec( Cof_Obj_t * pNode )
{
    if ( pNode->nFanins == 0 )
        return 0;
    if ( pNode->nFanouts++ > 0 )
        return 0;
    return 1 + Cof_NodeRef_rec( Cof_ObjFanin(pNode, 0) )
             + Cof_NodeRef_rec( Cof_ObjFanin(pNode, 1) );
}